

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_boundary.c
# Opt level: O3

mpt_value * iterBoundaryValue(mpt_iterator *it)

{
  uint uVar1;
  long lVar2;
  
  uVar1 = *(uint *)((long)&it[6]._vptr + 4);
  if (uVar1 < *(uint *)&it[6]._vptr) {
    lVar2 = 0x18;
    if (uVar1 != 0) {
      lVar2 = (ulong)(*(uint *)&it[6]._vptr - 1 <= uVar1) * 8 + 0x20;
    }
    it[1]._vptr = (_mpt_vptr_iterator *)((long)&it->_vptr + lVar2);
    it[2]._vptr = (_mpt_vptr_iterator *)0x64;
    return (mpt_value *)(it + 1);
  }
  return (mpt_value *)0x0;
}

Assistant:

static const MPT_STRUCT(value) *iterBoundaryValue(MPT_INTERFACE(iterator) *it)
{
	MPT_STRUCT(iteratorBoundary) *d = MPT_baseaddr(iteratorBoundary, it, _it);
	const double *val;
	
	if (d->pos >= d->elem) {
		return 0;
	}
	if (!d->pos) {
		val = &d->left;
	}
	else if (d->pos < (d->elem - 1)) {
		val = &d->inter;
	}
	else {
		val = &d->right;
	}
	MPT_value_set(&d->val, 'd', val);
	
	return &d->val;
}